

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O0

int mp::Lget(char **sp,int *Lp)

{
  char *pcVar1;
  int iVar2;
  char *s;
  int L;
  int c;
  int *Lp_local;
  char **sp_local;
  int local_4;
  
  for (s = *sp; *s == ' '; s = s + 1) {
  }
  iVar2 = (int)*s;
  if ((iVar2 < 0x30) || (pcVar1 = s, 0x39 < iVar2)) {
    return 1;
  }
  while( true ) {
    L = iVar2 + -0x30;
    s = pcVar1 + 1;
    iVar2 = (int)*s;
    if (iVar2 < 0x30 || 0x39 < iVar2) break;
    iVar2 = L * 10 + iVar2;
    pcVar1 = s;
  }
  *Lp = L;
  *sp = s;
  switch(*s) {
  default:
switchD_0012c984_caseD_1:
    local_4 = 1;
    break;
  case '\r':
    if (pcVar1[2] != '\n') goto switchD_0012c984_caseD_1;
    *sp = pcVar1 + 2;
  case '\0':
  case '\n':
  case ' ':
    local_4 = 0;
  }
  return local_4;
}

Assistant:

inline int
Lget(char **sp, int *Lp)
{
  int c;
  int L = 0;
  char *s = *sp;
  while(*s == ' ')
    s++;
  if ((c = *s++) < '0' || c > '9')
    return 1;
  L = c - '0';
  while((c = *s) >= '0' && c <= '9') {
    L = 10*L + c - '0';
    s++;
  }
  *Lp = L;
  *sp = s;
  switch(*s) {
  case '\r':
    if (*++s != '\n')
      break;
    *sp = s;
    /* no break */
  case 0:
  case ' ':
  case '\n':
    return 0;
  }
  return 1;
}